

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

TermList ApplicativeHelper::getNthArg(TermList arrowSort,uint argNum)

{
  ulong uVar1;
  uint64_t uVar2;
  
  if (argNum == 0) {
    return (TermList)2;
  }
  do {
    uVar2 = arrowSort._content;
    uVar1 = (ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff);
    argNum = argNum - 1;
    arrowSort._content = *(uint64_t *)(uVar2 + 0x20 + uVar1 * 8);
  } while (argNum != 0);
  return (TermList)*(uint64_t *)(uVar2 + 0x28 + uVar1 * 8);
}

Assistant:

TermList ApplicativeHelper::getNthArg(TermList arrowSort, unsigned argNum)
{
  ASS(argNum > 0);

  TermList res;
  while(argNum >=1){
    ASS(arrowSort.isArrowSort());
    res = *arrowSort.term()->nthArgument(0);
    arrowSort = *arrowSort.term()->nthArgument(1);
    argNum--;
  }
  return res;
}